

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex_in_memory.h
# Opt level: O1

void construction_worker_thread<std::pair<int,float>>
               (int number_of_threads,int thread_id,
               directed_flag_complex_in_memory_t<std::pair<int,_float>_> *result,
               directed_graph_t *graph,int max_dimension)

{
  long lVar1;
  byte bVar2;
  ulong uVar3;
  unsigned_long uVar4;
  ulong uVar5;
  vector<unsigned_short,_std::allocator<unsigned_short>_> possible_vertices;
  ushort local_7e;
  int local_7c;
  vector<unsigned_short,_std::allocator<unsigned_short>_> local_78;
  ulong local_58;
  long local_50;
  ulong local_48;
  directed_flag_complex_in_memory_t<std::pair<int,_float>_> *local_40;
  ulong local_38;
  
  local_48 = (ulong)graph->number_of_vertices;
  local_58 = (ulong)thread_id;
  if (local_58 < local_48) {
    local_50 = (long)number_of_threads;
    local_7c = max_dimension;
    local_40 = result;
    do {
      local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_finish = (unsigned_short *)0x0;
      local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_short *)0x0;
      uVar3 = graph->incidence_row_length;
      if (uVar3 != 0) {
        local_38 = local_58 & 0xffff;
        uVar5 = 0;
        do {
          uVar4 = (graph->incidence_outgoing).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar3 * local_38 + (uVar5 & 0xffff)];
          if (uVar4 != 0) {
            do {
              lVar1 = 0;
              if (uVar4 != 0) {
                for (; (uVar4 >> lVar1 & 1) == 0; lVar1 = lVar1 + 1) {
                }
              }
              local_7e = (ushort)lVar1 | (ushort)(uVar5 << 6);
              if (local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
                _M_realloc_insert<unsigned_short>
                          (&local_78,
                           (iterator)
                           local_78.
                           super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&local_7e);
              }
              else {
                *local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                 _M_impl.super__Vector_impl_data._M_finish = local_7e;
                local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl
                .super__Vector_impl_data._M_finish =
                     local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
              bVar2 = (byte)lVar1 & 0x3f;
              uVar4 = uVar4 & (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
            } while (uVar4 != 0);
          }
          uVar5 = uVar5 + 1;
          uVar3 = graph->incidence_row_length;
        } while (uVar5 < uVar3);
      }
      uVar3 = local_58;
      construct_children<std::pair<int,float>>
                ((local_40->vertex_cells).
                 super__Vector_base<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>,_std::allocator<directed_flag_complex_cell_in_memory_t<std::pair<int,_float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + local_58,graph,&local_78,local_7c,0);
      if (local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      local_58 = uVar3 + local_50;
    } while (local_58 < local_48);
  }
  return;
}

Assistant:

void construction_worker_thread(int number_of_threads, int thread_id,
                                directed_flag_complex_in_memory_t<ExtraData>* result, const directed_graph_t* graph,
                                int max_dimension) {
	const size_t number_of_vertices = graph->vertex_number();

	for (size_t index = thread_id; index < number_of_vertices; index += number_of_threads) {
		// Compute possible vertices
		std::vector<vertex_index_t> possible_vertices;
		for (size_t offset = 0; offset < graph->incidence_row_length; offset++) {
			size_t bits = graph->get_outgoing_chunk(vertex_index_t(index), vertex_index_t(offset));
			size_t vertex_offset = offset << 6;

			while (bits > 0) {
				// Get the least significant non-zero bit
				auto b = __builtin_ctzl(bits);

				// Unset this bit
				bits &= ~(ONE_ << b);
				possible_vertices.push_back(vertex_index_t(vertex_offset + b));
			}
		}
		construct_children(result->vertex_cells[index], *graph, possible_vertices, max_dimension);
	}
}